

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TtCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  word *pwVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  long lVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  int iVar22;
  undefined1 auVar19 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  
  uVar2 = (ulong)(uint)nVars;
  if (nVars < 7) {
    if (nVars != 6) {
      uVar4 = 1 << ((byte)nVars & 0x1f);
      uVar16 = (ulong)uVar4;
      uVar9 = ~(-1L << ((byte)uVar4 & 0x3f)) & *pTruth;
      if ((uint)nVars < 6) {
        uVar3 = uVar4 * 2;
        uVar8 = (ulong)uVar3;
        uVar5 = 0x40;
        if (0x40 < uVar8) {
          uVar5 = uVar8;
        }
        uVar8 = ((uVar5 - uVar8) - (ulong)(nVars != 5) >> ((byte)nVars & 0x3f)) +
                (ulong)(nVars != 5);
        lVar21 = (ulong)uVar4 * 2;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar9;
        auVar14._8_4_ = (int)uVar8;
        auVar14._0_8_ = uVar8;
        auVar14._12_4_ = (int)(uVar8 >> 0x20);
        uVar5 = 0xfffffffffffffffe;
        do {
          auVar12 = auVar11;
          auVar18._8_4_ = (int)uVar9;
          auVar18._0_8_ = uVar9;
          auVar18._12_4_ = (int)(uVar9 >> 0x20);
          auVar13._8_8_ = auVar18._8_8_ << lVar21;
          auVar13._0_8_ = uVar9 << uVar16;
          auVar11 = auVar13 | auVar12;
          uVar16 = uVar16 + uVar3;
          lVar21 = lVar21 + (ulong)uVar3;
          uVar5 = uVar5 + 2;
        } while ((uVar8 & 0xfffffffffffffffe) != uVar5);
        auVar17._8_4_ = (int)uVar5;
        auVar17._0_8_ = uVar5;
        auVar17._12_4_ = (int)(uVar5 >> 0x20);
        auVar14 = auVar14 ^ _DAT_0093d220;
        auVar18 = (auVar17 | _DAT_0093d210) ^ _DAT_0093d220;
        iVar23 = -(uint)(auVar14._0_4_ < auVar18._0_4_);
        iVar24 = -(uint)(auVar14._4_4_ < auVar18._4_4_);
        iVar25 = -(uint)(auVar14._8_4_ < auVar18._8_4_);
        iVar26 = -(uint)(auVar14._12_4_ < auVar18._12_4_);
        iVar20 = -(uint)(auVar18._4_4_ == auVar14._4_4_);
        iVar22 = -(uint)(auVar18._12_4_ == auVar14._12_4_);
        auVar15._4_4_ = iVar20;
        auVar15._0_4_ = iVar20;
        auVar15._8_4_ = iVar22;
        auVar15._12_4_ = iVar22;
        auVar1._4_4_ = iVar23;
        auVar1._0_4_ = iVar23;
        auVar1._8_4_ = iVar25;
        auVar1._12_4_ = iVar25;
        auVar19._4_4_ = iVar24;
        auVar19._0_4_ = iVar24;
        auVar19._8_4_ = iVar26;
        auVar19._12_4_ = iVar26;
        auVar19 = auVar19 | auVar15 & auVar1;
        auVar11 = ~auVar19 & auVar11 | auVar12 & auVar19;
        uVar9 = auVar11._8_8_ | auVar11._0_8_;
      }
      if (*pTruth != uVar9) {
        __assert_fail("*pTruth == nTruth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
      }
      if (nVars < 1) {
        return;
      }
    }
    uVar16 = *pTruth;
    pwVar10 = s_Truths6Neg;
    uVar9 = 0;
    do {
      uVar5 = (*pwVar10 & uVar16) - ((*pwVar10 & uVar16) >> 1 & 0x5555555555555555);
      uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
      uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
      uVar5 = (uVar5 >> 8) + uVar5;
      lVar21 = (uVar5 >> 0x10) + uVar5;
      pStore[uVar9] = (int)((ulong)lVar21 >> 0x20) + (int)lVar21 & 0xff;
      uVar9 = uVar9 + 1;
      pwVar10 = pwVar10 + 1;
    } while (uVar2 != uVar9);
  }
  else {
    memset(pStore,0,uVar2 * 4);
    if (nVars + -6 != 0x1f) {
      lVar21 = 0;
      do {
        uVar16 = pTruth[lVar21];
        uVar9 = pTruth[lVar21 + 1];
        pwVar10 = s_Truths6Neg;
        lVar6 = 0;
        do {
          uVar5 = (uVar9 & *pwVar10) << ((byte)(1 << ((byte)lVar6 & 0x1f)) & 0x3f) |
                  *pwVar10 & uVar16;
          if (uVar5 != 0) {
            uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
            uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
            uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
            uVar5 = (uVar5 >> 8) + uVar5;
            lVar7 = (uVar5 >> 0x10) + uVar5;
            pStore[lVar6] = pStore[lVar6] + ((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xffU);
          }
          lVar6 = lVar6 + 1;
          pwVar10 = pwVar10 + 1;
        } while (lVar6 != 6);
        if (uVar16 != 0) {
          uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
          uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
          uVar16 = (uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f;
          uVar16 = (uVar16 >> 8) + uVar16;
          lVar6 = (uVar16 >> 0x10) + uVar16;
          lVar7 = 0;
          do {
            if (((uint)lVar21 >> ((uint)lVar7 & 0x1f) & 1) == 0) {
              pStore[lVar7 + 6] =
                   pStore[lVar7 + 6] + ((int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xffU);
            }
            lVar7 = lVar7 + 1;
          } while (uVar2 - 6 != lVar7);
        }
        if (uVar9 != 0) {
          uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
          uVar16 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
          uVar16 = (uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f;
          uVar16 = (uVar16 >> 8) + uVar16;
          lVar6 = (uVar16 >> 0x10) + uVar16;
          lVar7 = 0;
          do {
            if ((((uint)lVar21 | 1) >> ((uint)lVar7 & 0x1f) & 1) == 0) {
              pStore[lVar7 + 6] =
                   pStore[lVar7 + 6] + ((int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xffU);
            }
            lVar7 = lVar7 + 1;
          } while (uVar2 - 6 != lVar7);
        }
        lVar21 = lVar21 + 2;
      } while (lVar21 < 1 << ((byte)(nVars + -6) & 0x1f));
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    word Temp;
    int i, k, Counter, nWords;
    if ( nVars <= 6 )
    {
        Abc_TtVerifySmallTruth(pTruth, nVars);
        for ( i = 0; i < nVars; i++ )
            pStore[i] = Abc_TtCountOnes( pTruth[0] & s_Truths6Neg[i] );
        return;
    }
    assert( nVars > 6 );
    nWords = Abc_TtWordNum( nVars );
    memset( pStore, 0, sizeof(int) * nVars );
    for ( k = 0; k < nWords; k++ )
    {
        // count 1's for the first six variables
        for ( i = 0; i < 6; i++ )
            if ( (Temp = (pTruth[k] & s_Truths6Neg[i]) | ((pTruth[k+1] & s_Truths6Neg[i]) << (1 << i))) )
                pStore[i] += Abc_TtCountOnes( Temp );
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
        k++;
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
    } 
}